

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

int __thiscall QPDF::getExtensionLevel(QPDF *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPDFObjectHandle obj;
  allocator<char> local_59;
  undefined1 local_58 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38;
  
  getRoot((QPDF *)local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"/Extensions",(allocator<char> *)(local_58 + 0x10));
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  iVar3 = 0;
  iVar2 = 0;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/Extensions",&local_59);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_58 + 0x10),(string *)local_58);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_58,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_58);
    iVar2 = iVar3;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"/ADBE",(allocator<char> *)(local_58 + 0x10));
      bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_58,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/ADBE",&local_59);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_58 + 0x10),(string *)local_58);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_58,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
        std::__cxx11::string::~string((string *)&local_38);
        bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_58);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,"/ExtensionLevel",(allocator<char> *)(local_58 + 0x10));
          bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_58,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"/ExtensionLevel",&local_59);
            QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_58 + 0x10),(string *)local_58);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_58,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
            std::__cxx11::string::~string((string *)&local_38);
            bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_58);
            if (bVar1) {
              iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_58);
            }
          }
        }
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return iVar2;
}

Assistant:

int
QPDF::getExtensionLevel()
{
    int result = 0;
    QPDFObjectHandle obj = getRoot();
    if (obj.hasKey("/Extensions")) {
        obj = obj.getKey("/Extensions");
        if (obj.isDictionary() && obj.hasKey("/ADBE")) {
            obj = obj.getKey("/ADBE");
            if (obj.isDictionary() && obj.hasKey("/ExtensionLevel")) {
                obj = obj.getKey("/ExtensionLevel");
                if (obj.isInteger()) {
                    result = obj.getIntValueAsInt();
                }
            }
        }
    }
    return result;
}